

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O3

void __thiscall TriangleMesh::TriangleMesh(TriangleMesh *this,string *filename)

{
  pointer pcVar1;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_78;
  string local_60;
  string local_40;
  
  (this->super_BasicContainer).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_0016a3e0;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + filename->_M_string_length);
  getpath(&local_40,&local_60);
  loadfromfile(&local_78,this,local_40._M_dataplus._M_p);
  BasicContainer::BasicContainer(&this->super_BasicContainer,&local_78);
  if (local_78.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  (this->super_BasicContainer).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_0016a3e0;
  return;
}

Assistant:

TriangleMesh(std::string filename):
		BasicContainer(loadfromfile(getpath(filename).c_str())) {}